

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

int text_sortcompare(void *z1,void *z2,void *zkeyinfo)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  bool bVar9;
  
  puVar4 = *z1;
  puVar2 = *z2;
  uVar1 = *(uint *)((long)zkeyinfo + 4);
  uVar5 = (ulong)uVar1;
  puVar8 = puVar4 + uVar5 * 4;
  uVar6 = uVar1;
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    if ((*puVar4 & 0xfffffffe) == 4) goto LAB_0018677c;
    puVar4 = puVar4 + 4;
  }
  puVar7 = puVar2 + uVar5 * 4;
  iVar3 = uVar1 + 1;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_001867f4;
    uVar1 = *puVar2;
    puVar2 = puVar2 + 4;
  } while ((uVar1 & 0xfffffffe) != 4);
LAB_0018679b:
  return -*zkeyinfo;
LAB_0018677c:
  iVar3 = (int)uVar5;
  uVar5 = (ulong)(iVar3 - 1);
  if (iVar3 == 0) goto LAB_0018679b;
  puVar7 = puVar2;
  puVar8 = puVar4;
  if ((*puVar2 & 0xfffffffe) == 4) goto LAB_00186816;
  puVar2 = puVar2 + 4;
  goto LAB_0018677c;
LAB_001867f4:
  uVar1 = *puVar8;
  uVar6 = *puVar7;
  if ((uVar1 & 0xfffffffe) == 4) goto code_r0x00186809;
  if ((uVar6 & 0xfffffffe) == 4) {
LAB_00186822:
    return *zkeyinfo;
  }
  if (uVar1 == 2) {
    if (uVar6 != 2) goto LAB_00186822;
    iVar3 = strcmp((char *)**(undefined8 **)(puVar8 + 2),(char *)**(undefined8 **)(puVar7 + 2));
    if (iVar3 != 0) {
      return iVar3 * *zkeyinfo;
    }
  }
  else if (uVar1 == 1) {
    if (uVar6 != 1) goto LAB_0018679b;
    if ((float)puVar8[2] < (float)puVar7[2]) goto LAB_0018679b;
    if ((float)puVar7[2] < (float)puVar8[2]) goto LAB_00186822;
  }
  puVar8 = puVar8 + 4;
  puVar7 = puVar7 + 4;
  goto LAB_001867f4;
code_r0x00186809:
  if ((uVar6 & 0xfffffffe) == 4) {
LAB_00186816:
    return -(uint)(puVar8 < puVar7) | 1;
  }
  goto LAB_0018679b;
}

Assistant:

static int text_sortcompare(const void *z1, const void *z2, void *zkeyinfo)
#endif
{
    const t_atom *a1 = *(t_atom **)z1, *a2 = *(t_atom **)z2;
    t_keyinfo *k = (t_keyinfo *)zkeyinfo;
    int count;
        /* advance first line by key onset and react if we run out early */
    for (count = k->ki_onset; count--; a1++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* if second line runs out early too consider them equal */
            for (count = k->ki_onset; count--; a2++)
                if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                    goto equal;
            return (-k->ki_forward);
        }
    }
    for (count = k->ki_onset; count--; a2++)
        if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (-k->ki_forward);
        /* compare remaining fields */
    for (; ; a1++, a2++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* hit end of first line */
            if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                 goto equal;
            else return (-k->ki_forward);
        }
        else if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (k->ki_forward); /* hit end of second line */

            /* otherwise if they're different return something, and
            if not proceed to next field */
        else if (a1->a_type == A_FLOAT)
        {
            if (a2->a_type == A_FLOAT)
            {
                if (a1->a_w.w_float < a2->a_w.w_float)
                    return (-k->ki_forward);
                else if (a1->a_w.w_float > a2->a_w.w_float)
                    return (k->ki_forward);
            }
            else return (-k->ki_forward);
        }
        else if (a1->a_type == A_SYMBOL)
        {
            if (a2->a_type == A_SYMBOL)
            {
                int z = strcmp(a1->a_w.w_symbol->s_name,
                    a2->a_w.w_symbol->s_name);
                if (z)
                    return (z * k->ki_forward);
            }
            else return (k->ki_forward);
        }
    }
equal:
    /* ran out of both lines at same time, so we're "equal".
    in this case compare pointers so that "equal" lines (which
    might not be identical because of a nonzero onset) stay in the
    same order as before. */
    if (a1 < a2)
        return (-1);
    else return (1);
}